

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldInfo
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  Descriptor *in_RCX;
  int i;
  Descriptor *in_stack_00000058;
  OneofDescriptor *in_stack_00000078;
  Printer *in_stack_00000080;
  GeneratorOptions *in_stack_00000088;
  Generator *in_stack_00000090;
  char *in_stack_ffffffffffffff08;
  char *oneof;
  Descriptor *in_stack_ffffffffffffff10;
  GeneratorOptions *in_stack_ffffffffffffff18;
  int local_b4;
  Descriptor *in_stack_ffffffffffffff50;
  GeneratorOptions *in_stack_ffffffffffffff58;
  char **in_stack_ffffffffffffff70;
  char (*in_stack_ffffffffffffff78) [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char (*in_stack_ffffffffffffff88) [10];
  char *in_stack_ffffffffffffff90;
  Printer *in_stack_ffffffffffffff98;
  string local_60 [16];
  Descriptor *in_stack_ffffffffffffffb0;
  GeneratorOptions *in_stack_ffffffffffffffb8;
  string local_40 [32];
  Descriptor *local_20;
  
  local_20 = in_RCX;
  bVar1 = anon_unknown_0::HasRepeatedFields(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  if (bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    (anonymous_namespace)::RepeatedFieldNumberList_abi_cxx11_
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffff08 = "rptfields";
    io::Printer::
    Print<char[10],std::__cxx11::string,char[14],char_const*,char[10],std::__cxx11::string>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,(char (*) [14])in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,(char (*) [10])in_stack_ffffffffffffffb0,
               &in_stack_ffffffffffffffb8->output_dir);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
  }
  bVar1 = anon_unknown_0::HasOneofFields((Descriptor *)in_stack_ffffffffffffff08);
  if (bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    (anonymous_namespace)::OneofGroupList_abi_cxx11_(in_stack_00000058);
    oneof = "oneofgroups";
    io::Printer::
    Print<char[10],std::__cxx11::string,char[16],char_const*,char[12],std::__cxx11::string>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               (char (*) [12])in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffb8->output_dir);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    for (local_b4 = 0; iVar2 = Descriptor::oneof_decl_count(local_20), local_b4 < iVar2;
        local_b4 = local_b4 + 1) {
      Descriptor::oneof_decl(local_20,local_b4);
      bVar1 = anon_unknown_0::IgnoreOneof((OneofDescriptor *)oneof);
      if (!bVar1) {
        Descriptor::oneof_decl(local_20,local_b4);
        GenerateOneofCaseDefinition
                  (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
      }
    }
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldInfo(const GeneratorOptions& options,
                                       io::Printer* printer,
                                       const Descriptor* desc) const {
  if (HasRepeatedFields(options, desc)) {
    printer->Print(
        "/**\n"
        " * List of repeated fields within this message type.\n"
        " * @private {!Array<number>}\n"
        " * @const\n"
        " */\n"
        "$classname$$rptfieldarray$ = $rptfields$;\n"
        "\n",
        "classname", GetMessagePath(options, desc), "rptfieldarray",
        kRepeatedFieldArrayName, "rptfields",
        RepeatedFieldNumberList(options, desc));
  }

  if (HasOneofFields(desc)) {
    printer->Print(
        "/**\n"
        " * Oneof group definitions for this message. Each group defines the "
        "field\n"
        " * numbers belonging to that group. When of these fields' value is "
        "set, all\n"
        " * other fields in the group are cleared. During deserialization, if "
        "multiple\n"
        " * fields are encountered for a group, only the last value seen will "
        "be kept.\n"
        " * @private {!Array<!Array<number>>}\n"
        " * @const\n"
        " */\n"
        "$classname$$oneofgrouparray$ = $oneofgroups$;\n"
        "\n",
        "classname", GetMessagePath(options, desc), "oneofgrouparray",
        kOneofGroupArrayName, "oneofgroups", OneofGroupList(desc));

    for (int i = 0; i < desc->oneof_decl_count(); i++) {
      if (IgnoreOneof(desc->oneof_decl(i))) {
        continue;
      }
      GenerateOneofCaseDefinition(options, printer, desc->oneof_decl(i));
    }
  }
}